

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O2

void __thiscall
preciseUnitOps_valid_Test::~preciseUnitOps_valid_Test(preciseUnitOps_valid_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseUnitOps, valid)
{
    EXPECT_FALSE(is_valid(precise::invalid));
    EXPECT_TRUE(is_valid(precise::defunit));
    EXPECT_TRUE(is_valid(precise::V));
    EXPECT_TRUE(is_valid(
        precise_unit(std::numeric_limits<double>::quiet_NaN(), precise::m)));
    EXPECT_FALSE(is_valid(precise_unit(
        std::numeric_limits<double>::quiet_NaN(),
        precise::invalid.base_units())));
    EXPECT_FALSE(is_valid(precise_unit(
        std::numeric_limits<double>::signaling_NaN(),
        precise::invalid.base_units())));
}